

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateProductionSwitch
          (GrammarOutputC *this,String *str,String *className,String *stackName,String *prefix,
          String *enumClassName)

{
  key_type *__k;
  uint *puVar1;
  Production *__lhs;
  String *pSVar2;
  __type_conflict _Var3;
  bool bVar4;
  size_t sVar5;
  mapped_type *ppbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  size_t local_188;
  String *local_180;
  undefined1 auStack_178 [8];
  vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
  prods;
  undefined1 local_158 [8];
  String tab;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  long local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  grammarSymbolsInv;
  String dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_GrammarOutput).pGrammar == (Grammar *)0x0) {
    sVar5 = 0;
  }
  else {
    tab.field_2._8_8_ = prefix;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_158,"    ",(allocator<char> *)local_d0);
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&dest._M_string_length;
    dest._M_dataplus._M_p = (pointer)0x0;
    dest._M_string_length._0_1_ = 0;
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+(&local_50,"namespace ",&this->namespaceName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_50,"\n{\n\n");
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator+(&local_f0,"bool ",className);
    std::operator+(&local_78,&local_f0,"::Reduce(Parse<");
    std::operator+(&local_50,&local_78,stackName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_50,"> &parse, unsigned productionID)\n{\n");
    std::__cxx11::string::append
              ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_f0);
    if (this->useEnumClasses == true) {
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     "switch (static_cast<");
      std::operator+(&local_50,&local_78,enumClassName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_50,">(productionID))\n");
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = &local_78;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     "switch (productionID)\n");
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "{\n");
    std::__cxx11::string::append
              ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_d0);
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&grammarSymbolsInv;
    grammarSymbolsInv._M_t._M_impl._0_4_ = 0;
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    Grammar::CreateInverseSymbols
              ((this->super_GrammarOutput).pGrammar,
               (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                *)local_d0);
    auStack_178 = (undefined1  [8])0x0;
    prods.
    super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    prods.
    super__Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180 = str;
    sVar5 = Grammar::CreateProductionVector
                      ((this->super_GrammarOutput).pGrammar,
                       (vector<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                        *)auStack_178);
    local_f8 = 1;
    uVar8 = 1;
    local_188 = sVar5;
    while (uVar8 < sVar5) {
      dest.field_2._8_8_ = uVar8;
      if (((*(pointer)((long)auStack_178 + uVar8 * 8))->Name)._M_string_length == 0) {
        sVar5 = 0;
        goto LAB_0011ce21;
      }
      std::operator+(&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::operator+(&local_f0,&local_118,"// ");
      ppbVar6 = std::
                map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                              *)local_d0,
                             &(*(pointer)((long)auStack_178 + dest.field_2._8_8_ * 8))->Left);
      std::operator+(&local_78,&local_f0,*ppbVar6);
      std::operator+(&local_50,&local_78," -> ");
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_118);
      if ((*(pointer)((long)auStack_178 + dest.field_2._8_8_ * 8))->Length == 0) {
        std::__cxx11::string::append
                  ((char *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        lVar7 = 4;
        for (uVar8 = 0; uVar8 < (*(pointer)((long)auStack_178 + dest.field_2._8_8_ * 8))->Length;
            uVar8 = uVar8 + 1) {
          puVar1 = (*(pointer)((long)auStack_178 + dest.field_2._8_8_ * 8))->pRight;
          __k = (key_type *)((long)puVar1 + lVar7);
          if (*(int *)((long)puVar1 + lVar7) < 0) {
            ppbVar6 = std::
                      map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                      ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                                    *)local_d0,__k);
            std::operator+(&local_78,"\'",*ppbVar6);
            std::operator+(&local_50,&local_78,"\'");
            std::__cxx11::string::append
                      ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_78);
          }
          else {
            std::
            map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                          *)local_d0,__k);
            std::__cxx11::string::append
                      ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
          }
          lVar7 = lVar7 + 4;
          std::__cxx11::string::append
                    ((char *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
      }
      std::__cxx11::string::append
                ((char *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::operator+(&local_78,&local_f0,"case ");
      bVar4 = this->useEnumClasses;
      if (bVar4 == true) {
        std::operator+(&local_1a8,enumClassName,"::");
        std::operator+(&local_118,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       tab.field_2._8_8_);
      }
      else {
        std::__cxx11::string::string((string *)&local_118,(string *)tab.field_2._8_8_);
      }
      std::operator+(&local_50,&local_78,&local_118);
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_118);
      if (bVar4 != false) {
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_f0);
      __lhs = *(pointer)((long)auStack_178 + dest.field_2._8_8_ * 8);
      _Var3 = std::operator==(&__lhs->Name,
                              &(*(pointer)((long)auStack_178 + (dest.field_2._8_8_ + -1) * 8))->Name
                             );
      sVar5 = local_188;
      if (_Var3) {
        local_f8 = local_f8 + 1;
        StringWithFormat<char>(&local_78,"%u");
        std::operator+(&local_50,&__lhs->Name,&local_78);
        std::__cxx11::string::append
                  ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        bVar4 = std::operator==(&__lhs->Name,"[Accept9]");
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"AcceptPVMRoot",&local_51);
        }
        else {
          std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
        }
        std::__cxx11::string::append
                  ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)&local_50);
        local_f8 = 1;
      }
      std::operator+(&local_118,":\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::operator+(&local_f0,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::operator+(&local_78,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::operator+(&local_50,&local_78,"break;\n\n");
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_118);
      uVar8 = dest.field_2._8_8_ + 1;
    }
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "}\n");
    std::operator+(&local_f0,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    pSVar2 = local_180;
    std::operator+(&local_78,&local_f0,"return true;\n");
    std::operator+(&local_50,&local_78,"}\n");
    std::__cxx11::string::append
              ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_118);
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+(&local_78,"\n} // namespace ",&this->namespaceName);
      std::operator+(&local_50,&local_78,"\n");
      std::__cxx11::string::append
                ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             *)local_d0);
    std::__cxx11::string::swap((string *)pSVar2);
LAB_0011ce21:
    std::
    _Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
    ::~_Vector_base((_Vector_base<SGParser::Generator::Production_*,_std::allocator<SGParser::Generator::Production_*>_>
                     *)auStack_178);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                 *)local_d0);
    std::__cxx11::string::~string
              ((string *)&grammarSymbolsInv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_158);
  }
  return sVar5;
}

Assistant:

size_t GrammarOutputC::CreateProductionSwitch(String& str, const String& className,
                                              const String& stackName, const String& prefix,
                                              const String& enumClassName) const {
    if (!pGrammar)
        return 0u;

    const String tab = "    ";
    String dest;

    // Begin namespace declaration of needed
    if (!namespaceName.empty())
        dest += "namespace " + namespaceName + "\n{\n\n";

    // *** Function declaration

    dest += "bool " + className + "::Reduce(Parse<" + stackName +
            "> &parse, unsigned productionID)\n{\n";

    // *** Switch statement declaration

    if (useEnumClasses)
        dest += tab + "switch (static_cast<" + enumClassName + ">(productionID))\n";
    else
        dest += tab + "switch (productionID)\n";

    dest += tab + "{\n";

    // *** Case statements

    // Create inverse symbols for string lookup
    std::map<unsigned, const String*> grammarSymbolsInv;
    pGrammar->GetInverseGrammarSymbols(grammarSymbolsInv);

    // Go through productions and assign pointers
    std::vector<Production*> prods;
    const auto size = pGrammar->CreateProductionVector(prods);

    // If there are multiple productions with the same name,
    // this counter will be used to generate different labels for them
    size_t sameNameCounter = 1u;

    // Go through the productions and build case statements
    // Starting from the 2nd, the first is always Accept
    for (size_t i = 1u; i < size; ++i) {
        // Return immediately in case of the empty production name
        if (prods[i]->Name.empty())
            return 0u;

        // Store the comment
        dest += tab + tab + "// " + *grammarSymbolsInv[prods[i]->Left] + " -> ";

        if (prods[i]->Length > 0u) {
            for (unsigned k = 0u; k < prods[i]->Length; ++k) {
                if (prods[i]->Right(k) & ProductionMask::Terminal)
                    dest += "'" + *grammarSymbolsInv[prods[i]->Right(k)] + "'";
                else
                    dest += *grammarSymbolsInv[prods[i]->Right(k)];
                dest += " ";
            }
        } else {
            dest += "<empty>";
        }

        dest += "\n";

        // Store the case statements
        dest += tab + tab + "case " + (useEnumClasses ? enumClassName + "::" + prefix : prefix);

        const auto& productionName = prods[i]->Name;

        // If there are multiple productions with the same name,
        // generate different labels for them
        if (productionName == prods[i - 1u]->Name) {
            ++sameNameCounter;
            dest += productionName + StringWithFormat("%u", sameNameCounter);
        } else {
            sameNameCounter = 1u;
            // Check why this special case exists
            dest += productionName == "[Accept9]" ? String{"AcceptPVMRoot"} : productionName;
        }

        dest += ":\n" + tab + tab + tab + "break;\n\n";
    }

    dest += tab + "}\n" + tab + "return true;\n" + "}\n";

    // Close namespace declaration of needed
    if (!namespaceName.empty())
        dest += "\n} // namespace " + namespaceName + "\n";

    // Clear the grammar symbol table because it did not originally exist
    grammarSymbolsInv.clear();

    str.swap(dest);

    return size;
}